

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O3

void __thiscall
cfdcapi_transaction_GetTransactionByHandle_Test::~cfdcapi_transaction_GetTransactionByHandle_Test
          (cfdcapi_transaction_GetTransactionByHandle_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(cfdcapi_transaction, GetTransactionByHandle) {
  static const char* exp_tx = "0100000000010136641869ca081e70f394c6948e8af409e18b619df2ed74aa106c1ca29787b96e0100000023220020a16b5755f7f6f96dbd65f5f0d6ab9418b89af4b1f14a1bb8a09062c35f0dcb54ffffffff0200e9a435000000001976a914389ffce9cd9ae88dcc0631e88a821ffdbe9bfe2688acc0832f05000000001976a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac080047304402206ac44d672dac41f9b00e28f4df20c52eeb087207e8d758d76d92c6fab3b73e2b0220367750dbbe19290069cba53d096f44530e4f98acaa594810388cf7409a1870ce01473044022068c7946a43232757cbdf9176f009a928e1cd9a1a8c212f15c1e11ac9f2925d9002205b75f937ff2f9f3c1246e547e54f62e027f64eefa2695578cc6432cdabce271502473044022059ebf56d98010a932cf8ecfec54c48e6139ed6adb0728c09cbe1e4fa0915302e022007cd986c8fa870ff5d2b3a89139c9fe7e499259875357e20fcbb15571c76795403483045022100fbefd94bd0a488d50b79102b5dad4ab6ced30c4069f1eaa69a4b5a763414067e02203156c6a5c9cf88f91265f5a942e96213afae16d83321c8b31bb342142a14d16381483045022100a5263ea0553ba89221984bd7f0b13613db16e7a70c549a86de0cc0444141a407022005c360ef0ae5a5d4f9f2f87a56c1546cc8268cab08c73501d6b3be2e1e1a8a08824730440220525406a1482936d5a21888260dc165497a90a15669636d8edca6b9fe490d309c022032af0c646a34a44d1f4576bf6a4a74b67940f8faa84c7df9abe12a01a11e2b4783cf56210307b8ae49ac90a048e9b53357a2354b3334e9c8bee813ecb98e99a7e07e8c3ba32103b28f0c28bfab54554ae8c658ac5c3e0ce6e79ad336331f78c428dd43eea8449b21034b8113d703413d57761b8b9781957b8c0ac1dfe69f492580ca4195f50376ba4a21033400f6afecb833092a9a21cfdf1ed1376e58c5d1f47de74683123987e967a8f42103a6d48b1131e94ba04d9737d61acdaa1322008af9602b3b14862c07a1789aac162102d8b661b0b3302ee2f162b09e07a55ad5dfbe673a9f01d9f0c19617681024306b56ae00000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* err_handle = NULL;
  ret = CfdCreateHandle(&err_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == err_handle));

  void* tx_handle = NULL;
  ret = CfdInitializeTxDataHandle(handle, kCfdNetworkMainnet, exp_tx, &tx_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((tx_handle == handle));
  if (ret == kCfdSuccess) {
    char* txid = nullptr;
    char* wtxid = nullptr;
    uint32_t size = 0;
    uint32_t vsize = 0;
    uint32_t weight = 0;
    uint32_t version = 0;
    uint32_t locktime = 0;
    ret = CfdGetTxInfoByHandle(
        handle, tx_handle, &txid, &wtxid, &size, &vsize,
        &weight, &version, &locktime);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(800, size);
    EXPECT_EQ(316, vsize);
    EXPECT_EQ(1262, weight);
    EXPECT_EQ(1, version);
    EXPECT_EQ(0, locktime);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("27eae69aff1dd4388c0fa05cbbfe9a3983d1b0b5811ebcd4199b86f299370aac", txid);
      EXPECT_STREQ("65dab5dd46a501fc695822c73d779067f2feb7c49dc47d39f86fdb2e3960b3bd", wtxid);
      CfdFreeStringBuffer(txid);
      CfdFreeStringBuffer(wtxid);
    }

    char* txin_txid = nullptr;
    char* script_sig = nullptr;
    uint32_t vout = 0;
    uint32_t sequence = 0;
    ret = CfdGetTxInByHandle(
        handle, tx_handle, 0,
        &txin_txid, &vout, &sequence, &script_sig);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("6eb98797a21c6c10aa74edf29d618be109f48a8e94c694f3701e08ca69186436", txin_txid);
      EXPECT_EQ(1, vout);
      EXPECT_EQ(4294967295, sequence);
      EXPECT_STREQ("220020a16b5755f7f6f96dbd65f5f0d6ab9418b89af4b1f14a1bb8a09062c35f0dcb54", script_sig);
      CfdFreeStringBuffer(txin_txid);
      CfdFreeStringBuffer(script_sig);
    }

    char* stack_data = nullptr;
    ret = CfdGetTxInWitnessByHandle(
        handle, tx_handle, kCfdTxWitnessStackNormal, 0, 7, &stack_data);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("56210307b8ae49ac90a048e9b53357a2354b3334e9c8bee813ecb98e99a7e07e8c3ba32103b28f0c28bfab54554ae8c658ac5c3e0ce6e79ad336331f78c428dd43eea8449b21034b8113d703413d57761b8b9781957b8c0ac1dfe69f492580ca4195f50376ba4a21033400f6afecb833092a9a21cfdf1ed1376e58c5d1f47de74683123987e967a8f42103a6d48b1131e94ba04d9737d61acdaa1322008af9602b3b14862c07a1789aac162102d8b661b0b3302ee2f162b09e07a55ad5dfbe673a9f01d9f0c19617681024306b56ae", stack_data);
      CfdFreeStringBuffer(stack_data);
    }

    int64_t value_satoshi = 0;
    char* locking_script = nullptr;
    ret = CfdGetTxOutByHandle(
        handle, tx_handle, 1, &value_satoshi, &locking_script, NULL);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(87000000, value_satoshi);
      EXPECT_STREQ("76a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac", locking_script);
      CfdFreeStringBuffer(locking_script);
    }

    uint32_t count = 0;
    ret = CfdGetTxInCountByHandle(
        handle, tx_handle, &count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, count);

    ret = CfdGetTxInWitnessCountByHandle(
        handle, tx_handle, kCfdTxWitnessStackNormal, 0, &count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(8, count);

    ret = CfdGetTxOutCountByHandle(
        handle, tx_handle, &count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2, count);

    uint32_t index = 0;
    ret = CfdGetTxInIndexByHandle(
        handle, tx_handle,
        "6eb98797a21c6c10aa74edf29d618be109f48a8e94c694f3701e08ca69186436", 1, &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(0, index);

    ret = CfdGetTxOutIndexByHandle(
        handle, tx_handle, "16AQVuBMt818u2HBcbxztAZTT2VTDKupPS", "", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(0, index);

    ret = CfdGetTxOutIndexWithOffsetByHandle(
        err_handle, tx_handle, 1, "16AQVuBMt818u2HBcbxztAZTT2VTDKupPS", "", &index);
    EXPECT_EQ(kCfdOutOfRangeError, ret);
    EXPECT_EQ(0, index);

    ret = CfdGetTxOutIndexByHandle(
        handle, tx_handle, "", "76a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);

    ret = CfdGetTxOutIndexWithOffsetByHandle(
        handle, tx_handle, 1, "", "76a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);

    ret = CfdFreeTxDataHandle(handle, tx_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
  ret = CfdFreeHandle(err_handle);
  EXPECT_EQ(kCfdSuccess, ret);
}